

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall
cmState::AppendCacheEntryProperty
          (cmState *this,string *key,string *property,string *value,bool asString)

{
  string *p;
  cmCacheManager *this_00;
  char *pcVar1;
  CacheIterator local_40;
  byte local_29;
  string *psStack_28;
  bool asString_local;
  string *value_local;
  string *property_local;
  string *key_local;
  cmState *this_local;
  
  local_29 = asString;
  psStack_28 = value;
  value_local = property;
  property_local = key;
  key_local = (string *)this;
  this_00 = cmake::GetCacheManager(this->CMakeInstance);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  local_40 = cmCacheManager::GetCacheIterator(this_00,pcVar1);
  p = value_local;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  cmCacheManager::CacheIterator::AppendProperty(&local_40,p,pcVar1,(bool)(local_29 & 1));
  return;
}

Assistant:

void cmState::AppendCacheEntryProperty(const std::string& key,
                                               const std::string& property,
                                               const std::string& value,
                                               bool asString)
{
  this->CMakeInstance->GetCacheManager()
       ->GetCacheIterator(key.c_str()).AppendProperty(property,
                                                       value.c_str(),
                                                       asString);
}